

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O3

XExtDisplayInfo * find_display(Display *dpy)

{
  XExtDisplayInfo *pXVar1;
  
  pXVar1 = (XExtDisplayInfo *)XextFindDisplay(&_nvctrl_ext_info_data,dpy);
  if (pXVar1 != (XExtDisplayInfo *)0x0) {
    return pXVar1;
  }
  pXVar1 = (XExtDisplayInfo *)
           XextAddDisplay(&_nvctrl_ext_info_data,dpy,"NV-CONTROL",&nvctrl_extension_hooks,5,
                          0xffffffffffffffff);
  return pXVar1;
}

Assistant:

static XEXT_GENERATE_FIND_DISPLAY (find_display, nvctrl_ext_info,
                                   nvctrl_extension_name, 
                                   &nvctrl_extension_hooks,
                                   NV_CONTROL_EVENTS, NVCTRL_EXT_NEED_CHECK)

static XEXT_GENERATE_CLOSE_DISPLAY (close_display, nvctrl_ext_info)

/*
 * NV-CONTROL versions 1.8 and 1.9 pack the target_type and target_id
 * fields in reversed order.  In order to talk to one of these servers,
 * we need to swap these fields.
 */
static void XNVCTRLCheckTargetData(Display *dpy, XExtDisplayInfo *info,
                                   int *target_type, int *target_id)
{
    /* Find out what the server's NV-CONTROL version is and
     * setup for swapping if we need to.
     */
    if (info->data == NVCTRL_EXT_NEED_CHECK) {
        int major, minor;

        if (XNVCTRLQueryVersion(dpy, &major, &minor)) {
            if (major == 1 &&
                (minor == 8 || minor == 9)) {
                info->data = NVCTRL_EXT_NEED_TARGET_SWAP;
            } else {
                info->data = NVCTRL_EXT_NEED_NOTHING;
            }
        } else {
            info->data = NVCTRL_EXT_NEED_NOTHING;
        }
    }

    /* We need to swap the target_type and target_id */
    if (info->data == NVCTRL_EXT_NEED_TARGET_SWAP) {
        int tmp;
        tmp = *target_type;
        *target_type = *target_id;
        *target_id = tmp;
    }
}